

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O3

void __thiscall llvm::detail::IEEEFloat::makeQuiet(IEEEFloat *this)

{
  uint uVar1;
  Significand *parts;
  
  if ((this->field_0x12 & 7) == 1) {
    uVar1 = this->semantics->precision;
    if (uVar1 - 0x40 < 0xffffff80) {
      parts = (Significand *)(this->significand).parts;
    }
    else {
      parts = &this->significand;
    }
    APInt::tcSetBit(&parts->part,uVar1 - 2);
    return;
  }
  __assert_fail("isNaN()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xecb,"void llvm::detail::IEEEFloat::makeQuiet()");
}

Assistant:

bool isNaN() const { return category == fcNaN; }